

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.h
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::NLWriter2
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this,FeederType *f,
          NLHeader h,NLUtils *utl)

{
  uint in_EAX;
  undefined8 uStack_18;
  
  (this->super_FormatterType).utils_ = utl;
  (this->super_FormatterType).nl_comments = true;
  (this->super_FormatterType).output_prec = 0;
  this->feeder_ = f;
  uStack_18._0_4_ = in_EAX;
  memcpy(&this->header_,&h,0x110);
  this->maxLen_ColName_ = 0;
  this->maxLen_UnvName_ = 0;
  *(undefined8 *)&this->maxLen_FixName_ = 0;
  *(undefined4 *)((long)&(this->nm).f_ + 4) = 0;
  uStack_18 = (ulong)(uint)uStack_18;
  std::
  pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<NLW2_WriteNLResultCode,_const_char_(&)[1],_true>
            (&this->result_,(NLW2_WriteNLResultCode *)((long)&uStack_18 + 4),(char (*) [1])0x116151)
  ;
  return;
}

Assistant:

NLWriter2(FeederType& f, NLHeader h, NLUtils& utl) :
    FormatterType(utl, f.WantNLComments(), f.OutputPrecision()),
    feeder_(f), header_(h) { }